

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O0

void __thiscall ANNkd_tree::SkeletonTree(ANNkd_tree *this,int n,int dd,int bs)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  ANNkd_leaf *pAVar4;
  ANNidx in_ECX;
  ANNidx in_EDX;
  int in_ESI;
  ANNidxArray in_RDI;
  int i;
  int in_stack_ffffffffffffffdc;
  ANNkd_leaf *in_stack_ffffffffffffffe0;
  int local_18;
  
  in_RDI[2] = in_EDX;
  in_RDI[3] = in_ESI;
  in_RDI[8] = in_ECX;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 0xc) = pvVar3;
  for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
    *(int *)(*(long *)(in_RDI + 0xc) + (long)local_18 * 4) = local_18;
  }
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  if (KD_TRIVIAL == (ANNkd_leaf *)0x0) {
    pAVar4 = (ANNkd_leaf *)operator_new(0x18);
    ANNkd_leaf::ANNkd_leaf(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_RDI);
    KD_TRIVIAL = pAVar4;
  }
  return;
}

Assistant:

void ANNkd_tree::SkeletonTree(  // construct skeleton tree
    int n,                      // number of points
    int dd,                     // dimension
    int bs)                     // bucket size
{
    dim = dd;  // initialize basic elements
    n_pts = n;
    bkt_size = bs;
    root = NULL;  // no associated tree yet
    pts = NULL;   // no associated points yet

    pidx = new int[n];  // allocate space for point indices
    for (int i = 0; i < n; i++) {
        pidx[i] = i;  // initially identity
    }
    bnd_box_lo = bnd_box_hi = NULL;  // bounding box is nonexistent
    if (KD_TRIVIAL == NULL)          // no trivial leaf node yet?
        KD_TRIVIAL = new ANNkd_leaf(0, IDX_TRIVIAL);  // allocate it
}